

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP3Writer::WriteCollectiveMetadataFile(BP3Writer *this,bool isFinal)

{
  BP3Serializer *this_00;
  TransportMan *this_01;
  _func_int *p_Var1;
  int iVar2;
  ScopedTimer __var2339;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportsNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpMetadataFileNames;
  ScopedTimer local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if (WriteCollectiveMetadataFile(bool)::__var339 == '\0') {
    iVar2 = __cxa_guard_acquire(&WriteCollectiveMetadataFile(bool)::__var339);
    if (iVar2 != 0) {
      WriteCollectiveMetadataFile::__var339 =
           (void *)ps_timer_create_("BP3Writer::WriteCollectiveMetadataFile");
      __cxa_guard_release(&WriteCollectiveMetadataFile(bool)::__var339);
    }
  }
  local_68.m_timer = WriteCollectiveMetadataFile::__var339;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  this_00 = &this->m_BP3Serializer;
  adios2::format::BP3Serializer::AggregateCollectiveMetadata
            (this_00,&(this->super_Engine).m_Comm,
             (BufferSTL *)
             ((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x88 +
             (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),true);
  if (*(int *)((this_00->super_BP3Base)._vptr_BP3Base[-3] + 0x10 +
              (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) == 0) {
    this_01 = &this->m_FileMetadataManager;
    transportman::TransportMan::GetFilesBaseNames
              (&local_60,this_01,&(this->super_Engine).m_Name,
               &((this->super_Engine).m_IO)->m_TransportsParameters);
    adios2::format::BP3Base::GetBPMetadataFileNames(&local_48,&this_00->super_BP3Base,&local_60);
    transportman::TransportMan::OpenFiles
              (this_01,&local_48,(this->super_Engine).m_OpenMode,
               &((this->super_Engine).m_IO)->m_TransportsParameters,
               (bool)((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x2e8)
                     [(long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base]);
    p_Var1 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
    transportman::TransportMan::WriteFiles
              (this_01,*(char **)(p_Var1 + 200 +
                                 (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),
               *(size_t *)
                (p_Var1 + 0xb8 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base),-1);
    transportman::TransportMan::CloseFiles(this_01,-1);
    if (!isFinal) {
      p_Var1 = (this_00->super_BP3Base)._vptr_BP3Base[-3];
      adios2::format::BPBase::ResetBuffer
                ((BPBase *)((long)&(this_00->super_BP3Base)._vptr_BP3Base + (long)p_Var1),
                 (Buffer *)(&(this_00->super_BP3Base).field_0x88 + (long)p_Var1),true,true);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->m_FileMetadataManager).m_Transports._M_h);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_68);
  return;
}

Assistant:

void BP3Writer::WriteCollectiveMetadataFile(const bool isFinal)
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::WriteCollectiveMetadataFile");
    m_BP3Serializer.AggregateCollectiveMetadata(m_Comm, m_BP3Serializer.m_Metadata, true);

    if (m_BP3Serializer.m_RankMPI == 0)
    {
        // first init metadata files
        const std::vector<std::string> transportsNames =
            m_FileMetadataManager.GetFilesBaseNames(m_Name, m_IO.m_TransportsParameters);

        const std::vector<std::string> bpMetadataFileNames =
            m_BP3Serializer.GetBPMetadataFileNames(transportsNames);

        m_FileMetadataManager.OpenFiles(bpMetadataFileNames, m_OpenMode,
                                        m_IO.m_TransportsParameters,
                                        m_BP3Serializer.m_Profiler.m_IsActive);

        m_FileMetadataManager.WriteFiles(m_BP3Serializer.m_Metadata.m_Buffer.data(),
                                         m_BP3Serializer.m_Metadata.m_Position);
        m_FileMetadataManager.CloseFiles();

        if (!isFinal)
        {
            m_BP3Serializer.ResetBuffer(m_BP3Serializer.m_Metadata, true);
            m_FileMetadataManager.m_Transports.clear();
        }
    }
}